

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswPairs.c
# Opt level: O0

int Ssw_SecWithPairs(Aig_Man_t *pAig1,Aig_Man_t *pAig2,Vec_Int_t *vIds1,Vec_Int_t *vIds2,
                    Ssw_Pars_t *pPars)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  abctime aVar5;
  Aig_Man_t *p;
  abctime aVar6;
  abctime clk;
  int RetValue;
  Aig_Man_t *pAigRes;
  Ssw_Pars_t *pPars_local;
  Vec_Int_t *vIds2_local;
  Vec_Int_t *vIds1_local;
  Aig_Man_t *pAig2_local;
  Aig_Man_t *pAig1_local;
  
  aVar5 = Abc_Clock();
  if ((vIds1 != (Vec_Int_t *)0x0) && (vIds2 != (Vec_Int_t *)0x0)) {
    Abc_Print(1,"Performing specialized verification with node pairs.\n");
    p = Ssw_SignalCorrespondenceWithPairs(pAig1,pAig2,vIds1,vIds2,pPars);
    iVar1 = Ssw_MiterStatus(p,1);
    if (iVar1 == 1) {
      Abc_Print(1,"Verification successful.  ");
    }
    else if (iVar1 == 0) {
      Abc_Print(1,"Verification failed with a counter-example.  ");
    }
    else {
      uVar2 = Aig_ManRegNum(p);
      iVar3 = Aig_ManRegNum(pAig1);
      iVar4 = Aig_ManRegNum(pAig2);
      Abc_Print(1,"Verification UNDECIDED. The number of remaining regs = %d (total = %d).  ",
                (ulong)uVar2,(ulong)(uint)(iVar3 + iVar4));
    }
    Abc_Print(1,"%s =","Time");
    aVar6 = Abc_Clock();
    Abc_Print(1,"%9.2f sec\n",((double)(aVar6 - aVar5) * 1.0) / 1000000.0);
    Aig_ManStop(p);
    return iVar1;
  }
  __assert_fail("vIds1 != NULL && vIds2 != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswPairs.c"
                ,0x181,
                "int Ssw_SecWithPairs(Aig_Man_t *, Aig_Man_t *, Vec_Int_t *, Vec_Int_t *, Ssw_Pars_t *)"
               );
}

Assistant:

int Ssw_SecWithPairs( Aig_Man_t * pAig1, Aig_Man_t * pAig2, Vec_Int_t * vIds1, Vec_Int_t * vIds2, Ssw_Pars_t * pPars )
{
    Aig_Man_t * pAigRes;
    int RetValue;
    abctime clk = Abc_Clock();
    assert( vIds1 != NULL && vIds2 != NULL );
    // try the new AIGs
    Abc_Print( 1, "Performing specialized verification with node pairs.\n" );
    pAigRes = Ssw_SignalCorrespondenceWithPairs( pAig1, pAig2, vIds1, vIds2, pPars );
    // report the results
    RetValue = Ssw_MiterStatus( pAigRes, 1 );
    if ( RetValue == 1 )
        Abc_Print( 1, "Verification successful.  " );
    else if ( RetValue == 0 )
        Abc_Print( 1, "Verification failed with a counter-example.  " );
    else
        Abc_Print( 1, "Verification UNDECIDED. The number of remaining regs = %d (total = %d).  ",
            Aig_ManRegNum(pAigRes), Aig_ManRegNum(pAig1) + Aig_ManRegNum(pAig2) );
    ABC_PRT( "Time", Abc_Clock() - clk );
    // cleanup
    Aig_ManStop( pAigRes );
    return RetValue;
}